

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_privkey.cpp
# Opt level: O0

void __thiscall
Privkey_ConvertWif_mainnnet_uncompressed_Test::TestBody
          (Privkey_ConvertWif_mainnnet_uncompressed_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_a8;
  Message local_a0;
  undefined1 local_98 [8];
  AssertionResult gtest_ar;
  string wif;
  Privkey privkey;
  allocator local_31;
  undefined1 local_30 [8];
  string hex;
  Privkey_ConvertWif_mainnnet_uncompressed_Test *this_local;
  
  hex.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_30,"305e293b010d29bf3c888b617763a438fee9054c8cab66eb12ad078f819d9f27",
             &local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  cfd::core::Privkey::Privkey((Privkey *)((long)&wif.field_2 + 8),(string *)local_30,kMainnet,true);
  cfd::core::Privkey::ConvertWif_abi_cxx11_
            ((string *)&gtest_ar.message_,(Privkey *)((long)&wif.field_2 + 8),kMainnet,false);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_98,"wif.c_str()",
             "\"5JBb5A38fjjeBnngkvRmCsXN6EY4w8jWvckik3hDvYQMcddGY23\"",pcVar2,
             "5JBb5A38fjjeBnngkvRmCsXN6EY4w8jWvckik3hDvYQMcddGY23");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar1) {
    testing::Message::Message(&local_a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_98);
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_privkey.cpp"
               ,100,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a8,&local_a0);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    testing::Message::~Message(&local_a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  std::__cxx11::string::~string((string *)&gtest_ar.message_);
  cfd::core::Privkey::~Privkey((Privkey *)((long)&wif.field_2 + 8));
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST(Privkey, ConvertWif_mainnnet_uncompressed) {
  std::string hex =
      "305e293b010d29bf3c888b617763a438fee9054c8cab66eb12ad078f819d9f27";
  Privkey privkey(hex);
  std::string wif = privkey.ConvertWif(NetType::kMainnet, false);
  EXPECT_STREQ(wif.c_str(),
               "5JBb5A38fjjeBnngkvRmCsXN6EY4w8jWvckik3hDvYQMcddGY23");
}